

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O3

void __thiscall BuildTestPhonyWithNoInputs::Run(BuildTestPhonyWithNoInputs *this)

{
  State *state;
  VirtualFileSystem *this_00;
  Builder *this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Test *pTVar2;
  bool bVar3;
  int iVar4;
  Node *pNVar5;
  string err;
  string local_70;
  string local_50;
  
  iVar4 = g_current_test->assertion_failures_;
  state = &(this->super_BuildTest).super_StateTestWithBuiltinRules.state_;
  AssertParse(state,
              "build nonexistent: phony\nbuild out1: cat || nonexistent\nbuild out2: cat nonexistent\n"
              ,(ManifestParserOptions)0x0);
  if (iVar4 != g_current_test->assertion_failures_) {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
    return;
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out1","");
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  this_00 = &(this->super_BuildTest).fs_;
  VirtualFileSystem::Create(this_00,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"out2","");
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
  VirtualFileSystem::Create(this_00,&local_70,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  pTVar2 = g_current_test;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out1","");
  this_01 = &(this->super_BuildTest).builder_;
  pNVar5 = Builder::AddTarget(this_01,&local_50,&local_70);
  testing::Test::Check
            (pTVar2,pNVar5 != (Node *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
             ,0x712,"builder_.AddTarget(\"out1\", &err)");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pTVar2 = g_current_test;
  iVar4 = std::__cxx11::string::compare((char *)&local_70);
  bVar3 = testing::Test::Check
                    (pTVar2,iVar4 == 0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                     ,0x713,"\"\" == err");
  pTVar2 = g_current_test;
  if (bVar3) {
    bVar3 = Builder::AlreadyUpToDate(this_01);
    testing::Test::Check
              (pTVar2,bVar3,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x714,"builder_.AlreadyUpToDate()");
    local_70._M_string_length = 0;
    *local_70._M_dataplus._M_p = '\0';
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&(this->super_BuildTest).command_runner_.commands_ran_,
                      (this->super_BuildTest).command_runner_.commands_ran_.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    State::Reset(state);
    pTVar2 = g_current_test;
    local_50._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"out2","");
    pNVar5 = Builder::AddTarget(this_01,&local_50,&local_70);
    testing::Test::Check
              (pTVar2,pNVar5 != (Node *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
               ,0x71a,"builder_.AddTarget(\"out2\", &err)");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != paVar1) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    pTVar2 = g_current_test;
    iVar4 = std::__cxx11::string::compare((char *)&local_70);
    bVar3 = testing::Test::Check
                      (pTVar2,iVar4 == 0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                       ,0x71b,"\"\" == err");
    pTVar2 = g_current_test;
    if (bVar3) {
      bVar3 = Builder::Build(this_01,&local_70);
      testing::Test::Check
                (pTVar2,bVar3,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x71c,"builder_.Build(&err)");
      pTVar2 = g_current_test;
      iVar4 = std::__cxx11::string::compare((char *)&local_70);
      testing::Test::Check
                (pTVar2,iVar4 == 0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                 ,0x71d,"\"\" == err");
      bVar3 = testing::Test::Check
                        (g_current_test,
                         (long)(this->super_BuildTest).command_runner_.commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->super_BuildTest).command_runner_.commands_ran_.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start == 0x20,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/build_test.cc"
                         ,0x71e,"1u == command_runner_.commands_ran_.size()");
      if (bVar3) goto LAB_0012dfc4;
    }
  }
  g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
LAB_0012dfc4:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

TEST_F(BuildTest, PhonyWithNoInputs) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"build nonexistent: phony\n"
"build out1: cat || nonexistent\n"
"build out2: cat nonexistent\n"));
  fs_.Create("out1", "");
  fs_.Create("out2", "");

  // out1 should be up to date even though its input is dirty, because its
  // order-only dependency has nothing to do.
  string err;
  EXPECT_TRUE(builder_.AddTarget("out1", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.AlreadyUpToDate());

  // out2 should still be out of date though, because its input is dirty.
  err.clear();
  command_runner_.commands_ran_.clear();
  state_.Reset();
  EXPECT_TRUE(builder_.AddTarget("out2", &err));
  ASSERT_EQ("", err);
  EXPECT_TRUE(builder_.Build(&err));
  EXPECT_EQ("", err);
  ASSERT_EQ(1u, command_runner_.commands_ran_.size());
}